

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

int number_textbox(mu_Context *ctx,mu_Real *value,mu_Rect r,mu_Id id)

{
  uint uVar1;
  double dVar2;
  int res;
  mu_Id id_local;
  mu_Real *value_local;
  mu_Context *ctx_local;
  mu_Rect r_local;
  
  if (((ctx->mouse_pressed == 1) && ((ctx->key_down & 1U) != 0)) && (ctx->hover == id)) {
    ctx->number_edit = id;
    sprintf(ctx->number_edit_buf,"%.3g",(double)*value);
  }
  if (ctx->number_edit == id) {
    uVar1 = mu_textbox_raw(ctx,ctx->number_edit_buf,0x7f,id,r,0);
    if (((uVar1 & 2) == 0) && (ctx->focus == id)) {
      return 1;
    }
    dVar2 = strtod(ctx->number_edit_buf,(char **)0x0);
    *value = (float)dVar2;
    ctx->number_edit = 0;
  }
  return 0;
}

Assistant:

static int number_textbox(mu_Context *ctx, mu_Real *value, mu_Rect r, mu_Id id) {
  if (ctx->mouse_pressed == MU_MOUSE_LEFT && ctx->key_down & MU_KEY_SHIFT &&
      ctx->hover == id
  ) {
    ctx->number_edit = id;
    sprintf(ctx->number_edit_buf, MU_REAL_FMT, *value);
  }
  if (ctx->number_edit == id) {
    int res = mu_textbox_raw(
      ctx, ctx->number_edit_buf, sizeof(ctx->number_edit_buf), id, r, 0);
    if (res & MU_RES_SUBMIT || ctx->focus != id) {
      *value = strtod(ctx->number_edit_buf, NULL);
      ctx->number_edit = 0;
    } else {
      return 1;
    }
  }
  return 0;
}